

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool RemoveSlitPair(ON_Brep *B,int LI,int lti0,int lti1,ON_BrepLoop **newloop)

{
  TYPE looptype;
  ON_BrepLoop *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TYPE TVar6;
  ON_BrepLoop *pOVar7;
  ON_BrepFace *pOVar8;
  ON_BrepTrim *pOVar9;
  ON_BrepTrim *pOVar10;
  int *piVar11;
  ON_BrepTrim *pOVar12;
  ON_BrepTrim *pOVar13;
  ON_BrepFace *newface_1;
  int fli;
  ON_BrepFace *newface;
  ON_BrepTrim *Tnext_1;
  ON_BrepTrim *Tprev_1;
  int tc;
  ON_BrepTrim *Tend;
  ON_BrepTrim *Tstart;
  ON_BrepTrim *T;
  int ltis;
  int lti;
  ON_BrepTrim *T1;
  ON_BrepTrim *T0;
  int temp;
  TYPE original_type;
  ON_BrepTrim *Tnext;
  ON_BrepTrim *Tprev;
  int iStack_60;
  bool NextPrev;
  int nti;
  int pti;
  int s1;
  int s0;
  int delta;
  ON_BrepFace *F;
  int trim_count;
  ON_BrepLoop *L;
  bool rc;
  ON_BrepLoop **newloop_local;
  int local_20;
  int lti1_local;
  int lti0_local;
  int LI_local;
  ON_Brep *B_local;
  
  B_local._7_1_ = false;
  pOVar7 = ON_Brep::Loop(B,LI);
  *newloop = (ON_BrepLoop *)0x0;
  iVar3 = ON_BrepLoop::TrimCount(pOVar7);
  if ((lti0 < 0) || (iVar3 <= lti0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_tools.cpp"
               ,0xa83,"","lti0>=0 && lti0<trim_count is false");
    B_local._7_1_ = false;
  }
  else if ((lti1 < 0) || (iVar3 <= lti1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_tools.cpp"
               ,0xa84,"","lti1>=0 && lti1<trim_count is false");
    B_local._7_1_ = false;
  }
  else if (lti0 == lti1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_tools.cpp"
               ,0xa85,"","lti0!=lti1 is false");
    B_local._7_1_ = false;
  }
  else {
    pOVar8 = ON_BrepLoop::Face(pOVar7);
    if (pOVar8 == (ON_BrepFace *)0x0) {
      B_local._7_1_ = false;
    }
    else if ((LI < 0) ||
            (iVar4 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&B->m_L),
            iVar4 <= LI)) {
      B_local._7_1_ = false;
    }
    else {
      iVar4 = ((lti0 - lti1) + iVar3) % iVar3;
      if ((iVar4 == 1) || (iVar4 == iVar3 + -1)) {
        pOVar9 = ON_BrepLoop::Trim(pOVar7,lti0);
        iVar3 = pOVar9->m_trim_index;
        pOVar9 = ON_BrepLoop::Trim(pOVar7,lti1);
        iVar4 = pOVar9->m_trim_index;
        iStack_60 = ON_Brep::PrevTrim(B,iVar3);
        if (iStack_60 == iVar4) {
          iStack_60 = ON_Brep::PrevTrim(B,iVar4);
          Tprev._4_4_ = ON_Brep::NextTrim(B,iVar3);
        }
        else {
          Tprev._4_4_ = ON_Brep::NextTrim(B,iVar4);
        }
        bVar2 = true;
        if ((iVar3 == iStack_60) || (iVar4 == iStack_60)) {
          bVar2 = false;
        }
        if ((((-1 < iVar3) &&
             (iVar5 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&B->m_T),
             iVar3 <= iVar5)) && (-1 < iVar4)) &&
           (iVar5 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&B->m_T),
           iVar4 <= iVar5)) {
          pOVar9 = ON_Brep::Trim(B,iVar3);
          ON_Brep::DeleteTrim(B,pOVar9,true);
          pOVar9 = ON_Brep::Trim(B,iVar4);
          ON_Brep::DeleteTrim(B,pOVar9,true);
          if (((bVar2) && (-1 < iStack_60)) &&
             ((-1 < Tprev._4_4_ && (iVar3 = ON_Brep::NextTrim(B,iStack_60), iVar3 == Tprev._4_4_))))
          {
            pOVar9 = ON_ClassArray<ON_BrepTrim>::operator[]
                               ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,iStack_60);
            pOVar10 = ON_ClassArray<ON_BrepTrim>::operator[]
                                ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,Tprev._4_4_);
            ON_Brep::MatchTrimEnds(B,pOVar9,pOVar10);
            (*(B->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(B,pOVar7,0);
          }
          B_local._7_1_ = true;
        }
      }
      else {
        looptype = pOVar7->m_type;
        if ((looptype == inner) || (looptype == outer)) {
          pOVar7 = ON_Brep::NewLoop(B,looptype);
          *newloop = pOVar7;
          pOVar7 = ON_Brep::Loop(B,LI);
          newloop_local._4_4_ = lti1;
          local_20 = lti0;
          if (lti1 < lti0) {
            newloop_local._4_4_ = lti0;
            local_20 = lti1;
          }
          pOVar9 = ON_BrepLoop::Trim(pOVar7,local_20);
          pOVar10 = ON_BrepLoop::Trim(pOVar7,newloop_local._4_4_);
          pOVar9->m_li = -1;
          pOVar10->m_li = -1;
          piVar11 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,local_20);
          *piVar11 = -1;
          piVar11 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,newloop_local._4_4_);
          *piVar11 = -1;
          T._4_4_ = local_20;
          while (T._4_4_ = T._4_4_ + 1, T._4_4_ < newloop_local._4_4_) {
            pOVar12 = ON_BrepLoop::Trim(pOVar7,T._4_4_);
            pOVar1 = *newloop;
            piVar11 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,T._4_4_);
            ON_SimpleArray<int>::Append(&pOVar1->m_ti,piVar11);
            pOVar12->m_li = (*newloop)->m_loop_index;
            piVar11 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,T._4_4_);
            *piVar11 = -1;
          }
          T._4_4_ = local_20;
          T._0_4_ = newloop_local._4_4_;
          while (T._0_4_ = (int)T + 1, (int)T < iVar3) {
            piVar11 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,(int)T);
            iVar4 = *piVar11;
            piVar11 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,T._4_4_);
            *piVar11 = iVar4;
            T._4_4_ = T._4_4_ + 1;
          }
          ON_SimpleArray<int>::SetCount(&pOVar7->m_ti,T._4_4_);
          (*newloop)->m_fi = pOVar7->m_fi;
          pOVar12 = ON_BrepLoop::Trim(*newloop,0);
          pOVar1 = *newloop;
          iVar3 = ON_BrepLoop::TrimCount(*newloop);
          pOVar13 = ON_BrepLoop::Trim(pOVar1,iVar3 + -1);
          ON_Brep::MatchTrimEnds(B,pOVar13,pOVar12);
          iVar3 = ON_BrepLoop::TrimCount(pOVar7);
          pOVar12 = ON_BrepLoop::Trim(pOVar7,(local_20 + -1 + iVar3) % iVar3);
          pOVar13 = ON_BrepLoop::Trim(pOVar7,(newloop_local._4_4_ + 1) % iVar3);
          ON_Brep::MatchTrimEnds(B,pOVar12,pOVar13);
          ON_Brep::DeleteTrim(B,pOVar9,true);
          ON_Brep::DeleteTrim(B,pOVar10,true);
          TVar6 = ON_Brep::ComputeLoopType(B,pOVar7);
          pOVar7->m_type = TVar6;
          TVar6 = ON_Brep::ComputeLoopType(B,*newloop);
          (*newloop)->m_type = TVar6;
          (*(B->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(B,pOVar7,0);
          (*(B->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(B,*newloop,0);
          if ((pOVar7->m_type == looptype) && ((*newloop)->m_type == inner)) {
            (*newloop)->m_fi = pOVar7->m_fi;
            ON_SimpleArray<int>::Append(&pOVar8->m_li,&(*newloop)->m_loop_index);
            B_local._7_1_ = true;
          }
          else if ((pOVar7->m_type == looptype) && ((*newloop)->m_type == outer)) {
            pOVar8 = ON_Brep::NewFace(B,pOVar8->m_si);
            ON_SimpleArray<int>::Append(&pOVar8->m_li,&(*newloop)->m_loop_index);
            (*newloop)->m_fi = pOVar8->m_face_index;
            B_local._7_1_ = true;
          }
          else if (((looptype == inner) && (pOVar7->m_type == outer)) &&
                  ((*newloop)->m_type == inner)) {
            (*newloop)->m_fi = pOVar7->m_fi;
            ON_SimpleArray<int>::Append(&pOVar8->m_li,&(*newloop)->m_loop_index);
            for (newface_1._4_4_ = 0; iVar3 = ON_BrepFace::LoopCount(pOVar8),
                newface_1._4_4_ < iVar3; newface_1._4_4_ = newface_1._4_4_ + 1) {
              piVar11 = ON_SimpleArray<int>::operator[](&pOVar8->m_li,newface_1._4_4_);
              if (*piVar11 == pOVar7->m_loop_index) {
                ON_SimpleArray<int>::Remove(&pOVar8->m_li,newface_1._4_4_);
                break;
              }
            }
            pOVar8 = ON_Brep::NewFace(B,pOVar8->m_si);
            ON_SimpleArray<int>::Append(&pOVar8->m_li,&pOVar7->m_loop_index);
            pOVar7->m_fi = pOVar8->m_face_index;
            B_local._7_1_ = true;
          }
          else if (((looptype == outer) && (pOVar7->m_type == inner)) &&
                  ((*newloop)->m_type == outer)) {
            (*newloop)->m_fi = pOVar7->m_fi;
            ON_SimpleArray<int>::Insert(&pOVar8->m_li,0,&(*newloop)->m_loop_index);
            B_local._7_1_ = true;
          }
        }
        else {
          B_local._7_1_ = false;
        }
      }
    }
  }
  return B_local._7_1_;
}

Assistant:

static 
bool RemoveSlitPair(ON_Brep& B, int LI, int lti0, int lti1, ON_BrepLoop*& newloop)
{
  bool rc = false;
  ON_BrepLoop* L = B.Loop(LI);
  newloop = nullptr;
  int trim_count = L->TrimCount();
  ON_ASSERT_OR_RETURN( lti0>=0 && lti0<trim_count, false );
  ON_ASSERT_OR_RETURN( lti1>=0 && lti1<trim_count, false );
  ON_ASSERT_OR_RETURN( lti0!=lti1, false );
  ON_BrepFace* F = L->Face();
  if( !F)
    return rc;
  if( LI<0 || LI>=B.m_L.Count())
    return rc;


  int delta = (lti0-lti1+trim_count)%trim_count;

  if( delta == 1 || delta == trim_count-1){
    // trims are consecutive. Just remove them
      int s0 = L->Trim(lti0)->m_trim_index;
      int s1 = L->Trim(lti1)->m_trim_index;
      int pti = B.PrevTrim(s0);
      int nti;
      if (pti == s1){
        pti = B.PrevTrim(s1);
        nti = B.NextTrim(s0);
      }
      else 
        nti = B.NextTrim(s1);

			// TRR#62112 crashed when the loop consist only of Trim(lti0) and Trim(lti1)
			bool NextPrev =true;		// true when pti and nti are distinct from s0 and s1
			if( s0==pti || s1==pti)
				NextPrev = false;

      if( s0>=0 && s0<= B.m_T.Count() && s1>=0 && s1<= B.m_T.Count() ){ 
        B.DeleteTrim(*B.Trim(s0), true);
        B.DeleteTrim(*B.Trim(s1), true);
        if (NextPrev && pti >= 0 && nti >= 0 && B.NextTrim(pti) == nti){
          ON_BrepTrim& Tprev = B.m_T[pti];
          ON_BrepTrim& Tnext = B.m_T[nti];
          B.MatchTrimEnds( Tprev, Tnext );  

          // set m_type fields
          // set m_pbox
          B.SetTrimBoundingBoxes(*L);
        }

        rc = true;
      }
  }
  else{
    // Trims are not consecutive
    // Split the existing loop into 2 loops
    ON_BrepLoop::TYPE original_type = L->m_type;
    if( original_type!=ON_BrepLoop::inner && original_type!=ON_BrepLoop::outer)
      return false;

    newloop = &B.NewLoop(original_type);    // Check and possibly change the type later
    L = B.Loop(LI);                         // Refresh L after possible reallocation of m_L array
    if(lti0>lti1){
      int temp = lti0;
      lti0 = lti1;
      lti1 = temp;
    }

     // remove slit trims from the loop
    ON_BrepTrim& T0 = *L->Trim(lti0);
    ON_BrepTrim& T1 = *L->Trim(lti1);
    T0.m_li = -1;
    T1.m_li = -1;
    L->m_ti[lti0] = -1;
    L->m_ti[lti1] = -1;

    // build newloop->m_ti array by moving trims from L->m_ti
    int lti, ltis;
    for(lti=lti0+1; lti<lti1; lti++){
      ON_BrepTrim* T = L->Trim(lti);
      newloop->m_ti.Append( L->m_ti[lti] );
      T->m_li = newloop->m_loop_index;
      L->m_ti[lti] = -1;
    }

    for( lti = lti0, ltis = lti1+1 ; ltis<trim_count; lti++, ltis++)
      L->m_ti[lti] = L->m_ti[ltis];
    L->m_ti.SetCount(lti);


//  Tune up newly adjacent trims to be sure they meet spot on.
    newloop->m_fi = L->m_fi;          // temporarily put the newloop on same face as old loop
    ON_BrepTrim& Tstart = *newloop->Trim(0);
    ON_BrepTrim& Tend = *newloop->Trim( newloop->TrimCount()-1);
    B.MatchTrimEnds( Tend , Tstart );  

    int tc = L->TrimCount();
    ON_BrepTrim& Tprev = *L->Trim( ( lti0 -1 + tc)%tc);
    ON_BrepTrim& Tnext = *L->Trim( ( lti1+1)%tc) ;
    B.MatchTrimEnds( Tprev, Tnext );  

    B.DeleteTrim(T0, true);
    B.DeleteTrim(T1, true); 

    // set m_type fields
    L->m_type = B.ComputeLoopType(*L);
    newloop->m_type = B.ComputeLoopType(*newloop);

    // set m_pbox
    B.SetTrimBoundingBoxes(*L);
    B.SetTrimBoundingBoxes(*newloop);

    if( L->m_type==original_type && newloop->m_type==ON_BrepLoop::inner){
      // Add new inner loop to original face
      newloop->m_fi = L->m_fi;
      F->m_li.Append(newloop->m_loop_index);
      rc = true;
    }
    else if( L->m_type==original_type && newloop->m_type==ON_BrepLoop::outer){
      // New loop is outer loop on a new face
      ON_BrepFace& newface = B.NewFace( F->m_si );
      F = nullptr;       // F may no longer be a valid pointer because of array reallocation
      newface.m_li.Append( newloop->m_loop_index);
      newloop->m_fi = newface.m_face_index;
      rc = true;
    }
    else if( original_type==ON_BrepLoop::inner && 
              L->m_type== ON_BrepLoop::outer && 
              newloop->m_type == ON_BrepLoop::inner)
    { 
      // Add new inner loop to original face
      newloop->m_fi = L->m_fi;
      F->m_li.Append( newloop->m_loop_index );

      // Remove L from *F.  Move L to a new face
      for(int fli=0; fli<F->LoopCount(); fli++)
        if( F->m_li[fli]==L->m_loop_index  ) {
          F->m_li.Remove(fli);
          break;
        }

      // Place L on a new face
      ON_BrepFace& newface = B.NewFace( F->m_si );
      F = nullptr;       // F may no longer be a valid pointer because of array reallocation
      newface.m_li.Append( L->m_loop_index);
      L->m_fi = newface.m_face_index;
      rc = true;
    }
    else if( original_type==ON_BrepLoop::outer && 
              L->m_type== ON_BrepLoop::inner && 
              newloop->m_type == ON_BrepLoop::outer)
    {  
      // Add new outer loop to original face
      newloop->m_fi = L->m_fi;
      F->m_li.Insert(0,newloop->m_loop_index);  
      rc =  true;
    }
  }
  return rc;

}